

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cborencoder.c
# Opt level: O0

CborError cbor_encode_simple_value(CborEncoder *encoder,uint8_t value)

{
  byte in_SIL;
  CborEncoder *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  if ((in_SIL < 0x19) || (0x1f < in_SIL)) {
    local_4 = encode_number(in_RDI,CONCAT17(in_SIL,in_stack_ffffffffffffffe8),'\0');
  }
  else {
    local_4 = CborErrorIllegalSimpleType;
  }
  return local_4;
}

Assistant:

CborError cbor_encode_simple_value(CborEncoder *encoder, uint8_t value)
{
#ifndef CBOR_ENCODER_NO_CHECK_USER
    /* check if this is a valid simple type */
    if (value >= HalfPrecisionFloat && value <= Break)
        return CborErrorIllegalSimpleType;
#endif
    return encode_number(encoder, value, SimpleTypesType << MajorTypeShift);
}